

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O3

void __thiscall
klogic::mvn::learn(mvn *this,const_iterator Xbeg,const_iterator Xend,cmplx *error,
                  double learning_rate,bool variable_rate)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  pointer pcVar4;
  double dVar5;
  double __z;
  double dVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 local_58 [24];
  complex<double> local_40;
  
  pcVar4 = (this->weights).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->weights).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4;
  lVar2 = lVar1 >> 4;
  if (lVar2 == ((long)Xend._M_current - (long)Xbeg._M_current >> 4) + 1) {
    auVar9._0_8_ = learning_rate * *(double *)error->_M_value;
    auVar9._8_8_ = learning_rate * *(double *)(error->_M_value + 8);
    auVar10._8_4_ = (int)(lVar1 >> 0x24);
    auVar10._0_8_ = lVar2;
    auVar10._12_4_ = 0x45300000;
    dVar5 = (double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0;
    dVar8 = auVar10._8_8_ - 1.9342813113834067e+25;
    auVar6._0_8_ = dVar8 + dVar5;
    auVar6._8_8_ = dVar8 + dVar5;
    auVar10 = divpd(auVar9,auVar6);
    if (variable_rate) {
      weighted_sum(this,Xbeg,Xend);
      auVar7._0_8_ = cabs(__z);
      auVar7._8_8_ = auVar7._0_8_;
      auVar10 = divpd(auVar10,auVar7);
      pcVar4 = (this->weights).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    dVar5 = *(double *)(pcVar4->_M_value + 8);
    *(double *)pcVar4->_M_value = *(double *)pcVar4->_M_value + auVar10._0_8_;
    *(double *)(pcVar4->_M_value + 8) = dVar5 + auVar10._8_8_;
    if (pcVar4 + 1 !=
        (this->weights).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar1 = 0;
      do {
        local_40._M_value._0_8_ = *(undefined8 *)((Xbeg._M_current)->_M_value + lVar1);
        local_40._M_value._8_8_ =
             *(ulong *)((Xbeg._M_current)->_M_value + lVar1 + 8) ^ 0x8000000000000000;
        local_58._0_16_ = auVar10;
        std::complex<double>::operator*=((complex<double> *)local_58,&local_40);
        pcVar3 = (pointer)((pcVar4 + 1)[1]._M_value + lVar1);
        dVar5 = *(double *)(pcVar3[-1]._M_value + 8);
        *(double *)pcVar3[-1]._M_value = (double)local_58._0_8_ + *(double *)pcVar3[-1]._M_value;
        *(double *)(pcVar3[-1]._M_value + 8) = (double)local_58._8_8_ + dVar5;
        lVar1 = lVar1 + 0x10;
      } while (pcVar3 != (this->weights).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    return;
  }
  __assert_fail("weights.size() == Xend - Xbeg + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                0x28,
                "void klogic::mvn::learn(cvector::const_iterator, cvector::const_iterator, const cmplx &, double, bool)"
               );
}

Assistant:

void klogic::mvn::learn(cvector::const_iterator Xbeg,
                        cvector::const_iterator Xend,
                        const cmplx &error, double learning_rate, bool variable_rate)
{
    assert(weights.size() == Xend - Xbeg + 1);

    cmplx factor = error * learning_rate / (double)weights.size(); // division by N+1

    if (variable_rate)
        factor /= std::abs(weighted_sum(Xbeg, Xend));

    cvector::iterator       w = weights.begin();
    cvector::const_iterator x = Xbeg;

    // cout << "learn(): error=" << error << " factor=" << factor << "weights before: " << weights_vector() << endl;

    *w++ += factor;         // change bias

    for (; w != weights.end(); w++, x++) {
        *w += factor * std::conj(*x);
    }

    // cout << "learn(): weights after: " << weights_vector() << endl;

}